

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_cepstrum_power_normalization.cc
# Opt level: O2

void __thiscall
sptk::MelCepstrumPowerNormalization::MelCepstrumPowerNormalization
          (MelCepstrumPowerNormalization *this,int num_order,int impulse_response_length,
          double alpha)

{
  this->_vptr_MelCepstrumPowerNormalization =
       (_func_int **)&PTR__MelCepstrumPowerNormalization_0011e3e0;
  FrequencyTransform::FrequencyTransform
            (&this->frequency_transform_,num_order,impulse_response_length + -1,-alpha);
  CepstrumToAutocorrelation::CepstrumToAutocorrelation
            (&this->cepstrum_to_autocorrelation_,impulse_response_length + -1,0,
             impulse_response_length);
  this->is_valid_ = true;
  if (((this->frequency_transform_).is_valid_ != true) ||
     ((this->cepstrum_to_autocorrelation_).is_valid_ == false)) {
    this->is_valid_ = false;
  }
  return;
}

Assistant:

MelCepstrumPowerNormalization::MelCepstrumPowerNormalization(
    int num_order, int impulse_response_length, double alpha)
    : frequency_transform_(num_order, impulse_response_length - 1, -alpha),
      cepstrum_to_autocorrelation_(impulse_response_length - 1, 0,
                                   impulse_response_length),
      is_valid_(true) {
  if (!frequency_transform_.IsValid() ||
      !cepstrum_to_autocorrelation_.IsValid()) {
    is_valid_ = false;
    return;
  }
}